

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1.c
# Opt level: O0

void rhash_sha1_update(sha1_ctx *ctx,uchar *msg,size_t size)

{
  ulong uVar1;
  uint uVar2;
  uint uVar3;
  size_t local_48;
  sha1_ctx *local_30;
  uint *aligned_message_block;
  uint left;
  uint index;
  size_t size_local;
  uchar *msg_local;
  sha1_ctx *ctx_local;
  
  uVar1 = ctx->length;
  uVar2 = (uint)uVar1 & 0x3f;
  ctx->length = size + ctx->length;
  _left = size;
  size_local = (size_t)msg;
  if ((uVar1 & 0x3f) != 0) {
    uVar3 = 0x40 - uVar2;
    local_48 = size;
    if (uVar3 <= size) {
      local_48 = (size_t)uVar3;
    }
    memcpy(ctx->message + uVar2,msg,local_48);
    if (size < uVar3) {
      return;
    }
    rhash_sha1_process_block(ctx->hash,(uint *)ctx);
    size_local = (size_t)(msg + uVar3);
    _left = size - uVar3;
  }
  for (; 0x3f < _left; _left = _left - 0x40) {
    if ((size_local & 3) == 0) {
      local_30 = (sha1_ctx *)size_local;
    }
    else {
      memcpy(ctx,(void *)size_local,0x40);
      local_30 = ctx;
    }
    rhash_sha1_process_block(ctx->hash,(uint *)local_30);
    size_local = size_local + 0x40;
  }
  if (_left != 0) {
    memcpy(ctx,(void *)size_local,_left);
  }
  return;
}

Assistant:

void rhash_sha1_update(sha1_ctx* ctx, const unsigned char* msg, size_t size)
{
	unsigned index = (unsigned)ctx->length & 63;
	ctx->length += size;

	/* fill partial block */
	if (index) {
		unsigned left = sha1_block_size - index;
		memcpy(ctx->message + index, msg, (size < left ? size : left));
		if (size < left) return;

		/* process partial block */
		rhash_sha1_process_block(ctx->hash, (unsigned*)ctx->message);
		msg  += left;
		size -= left;
	}
	while (size >= sha1_block_size) {
		unsigned* aligned_message_block;
		if (IS_ALIGNED_32(msg)) {
			/* the most common case is processing of an already aligned message
			without copying it */
			aligned_message_block = (unsigned*)msg;
		} else {
			memcpy(ctx->message, msg, sha1_block_size);
			aligned_message_block = (unsigned*)ctx->message;
		}

		rhash_sha1_process_block(ctx->hash, aligned_message_block);
		msg  += sha1_block_size;
		size -= sha1_block_size;
	}
	if (size) {
		/* save leftovers */
		memcpy(ctx->message, msg, size);
	}
}